

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitBitVector.h
# Opt level: O2

bool __thiscall BVUnitT<unsigned_long>::Dump(BVUnitT<unsigned_long> *this,BVIndex base,bool hasBits)

{
  long lVar1;
  uint index;
  BVUnitT<unsigned_long> local_38;
  BVUnitT<unsigned_long> _unit;
  
  local_38 = (BVUnitT<unsigned_long>)this->word;
  lVar1 = 0;
  if (local_38.word != 0) {
    for (; (local_38.word >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
    }
  }
  while (local_38.word != 0) {
    index = -(uint)(local_38.word == 0) | (uint)lVar1;
    Clear(&local_38,index);
    if ((hasBits & 1U) != 0) {
      Output::Print(L", ");
    }
    Output::Print(L"%u",(ulong)(index + base));
    lVar1 = 0;
    if (local_38.word != 0) {
      for (; (local_38.word >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    hasBits = true;
  }
  return (bool)(hasBits & 1);
}

Assistant:

bool Dump(BVIndex base = 0, bool hasBits = false) const
    {
        FOREACH_BITSET_IN_UNITBV(index, *this, BVUnitT)
        {
            if (hasBits)
            {
                Output::Print(_u(", "));
            }
            Output::Print(_u("%u"), index + base);
            hasBits = true;
        }
        NEXT_BITSET_IN_UNITBV;
        return hasBits;
    }